

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall perfetto::protos::gen::ObservableEvents::~ObservableEvents(ObservableEvents *this)

{
  (this->super_CppMessageObj)._vptr_CppMessageObj = (_func_int **)&PTR__ObservableEvents_00406fb8;
  ::std::__cxx11::string::~string((string *)&this->unknown_fields_);
  std::
  vector<perfetto::protos::gen::ObservableEvents_DataSourceInstanceStateChange,_std::allocator<perfetto::protos::gen::ObservableEvents_DataSourceInstanceStateChange>_>
  ::~vector(&this->instance_state_changes_);
  return;
}

Assistant:

ObservableEvents::~ObservableEvents() = default;